

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraCore.c
# Opt level: O3

void Fra_FraigSweep(Fra_Man_t *p)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  int Pos;
  Vec_Ptr_t *pVVar4;
  Aig_Man_t *pAVar5;
  Aig_Obj_t *p1;
  Fra_Par_t *pFVar6;
  Aig_Obj_t *pAVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  
  pAVar5 = p->pManAig;
  uVar10 = pAVar5->nObjs[2] - pAVar5->nRegs;
  pVVar4 = pAVar5->vCis;
  Pos = 0;
  if ((int)uVar10 < pVVar4->nSize) {
    uVar8 = (ulong)uVar10;
    Pos = 0;
    do {
      if ((int)uVar10 < 0) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pAVar3 = (Aig_Obj_t *)pVVar4->pArray[uVar8];
      Fra_FraigNode(p,pAVar3);
      if (p->pPars->fUseImps != 0) {
        Pos = Fra_ImpCheckForNode(p,p->pCla->vImps,pAVar3,Pos);
      }
      uVar8 = uVar8 + 1;
      pAVar5 = p->pManAig;
      pVVar4 = pAVar5->vCis;
    } while ((int)uVar8 < pVVar4->nSize);
  }
  pFVar6 = p->pPars;
  if (pFVar6->fLatchCorr == 0) {
    pVVar4 = pAVar5->vObjs;
    if (0 < pVVar4->nSize) {
      iVar1 = pFVar6->nBTLimitNode;
      lVar9 = 0;
      do {
        pAVar3 = (Aig_Obj_t *)pVVar4->pArray[lVar9];
        if ((pAVar3 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar3->field_0x18 & 7) - 7)) {
          if (((ulong)pAVar3 & 1) != 0) {
            __assert_fail("!Aig_IsComplement(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fra.h"
                          ,0x110,"Aig_Obj_t *Fra_ObjChild0Fra(Aig_Obj_t *, int)");
          }
          iVar2 = p->pPars->nFramesK;
          uVar8 = (ulong)pAVar3->pFanin0 & 0xfffffffffffffffe;
          if (uVar8 == 0) {
            pAVar7 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar7 = (Aig_Obj_t *)
                     ((ulong)((uint)pAVar3->pFanin0 & 1) ^
                     *(ulong *)(*(long *)(*(long *)(uVar8 + 0x28) + 0x20) +
                               (long)(*(int *)(*(long *)(uVar8 + 0x28) + 0x18) *
                                      *(int *)(uVar8 + 0x24) + iVar2) * 8));
          }
          uVar8 = (ulong)pAVar3->pFanin1 & 0xfffffffffffffffe;
          if (uVar8 == 0) {
            p1 = (Aig_Obj_t *)0x0;
          }
          else {
            p1 = (Aig_Obj_t *)
                 ((ulong)((uint)pAVar3->pFanin1 & 1) ^
                 *(ulong *)(*(long *)(*(long *)(uVar8 + 0x28) + 0x20) +
                           (long)(*(int *)(*(long *)(uVar8 + 0x28) + 0x18) * *(int *)(uVar8 + 0x24)
                                 + iVar2) * 8));
          }
          pAVar7 = Aig_And(p->pManFraig,pAVar7,p1);
          *(Aig_Obj_t **)
           (*(long *)((long)(pAVar3->field_5).pData + 0x20) +
           ((long)*(int *)((long)(pAVar3->field_5).pData + 0x18) * (long)pAVar3->Id +
           (long)p->pPars->nFramesK) * 8) = pAVar7;
          *(Fra_Man_t **)(((ulong)pAVar7 & 0xfffffffffffffffe) + 0x28) = p;
          if (p->pManFraig->pData == (void *)0x0) {
            iVar2 = p->pPars->nLevelMax;
            if ((iVar2 != 0) && (iVar2 < (int)(*(uint *)&pAVar3->field_0x1c & 0xffffff))) {
              p->pPars->nBTLimitNode = 5;
            }
            Fra_FraigNode(p,pAVar3);
            pFVar6 = p->pPars;
            if ((pFVar6->nLevelMax != 0) &&
               (pFVar6->nLevelMax < (int)(*(uint *)&pAVar3->field_0x1c & 0xffffff))) {
              pFVar6->nBTLimitNode = iVar1;
            }
            if (pFVar6->fUseImps != 0) {
              Pos = Fra_ImpCheckForNode(p,p->pCla->vImps,pAVar3,Pos);
            }
          }
        }
        lVar9 = lVar9 + 1;
        pVVar4 = p->pManAig->vObjs;
      } while (lVar9 < pVVar4->nSize);
      pFVar6 = p->pPars;
    }
    p->nNodesMiter = p->pManFraig->nObjs[6] + p->pManFraig->nObjs[5];
    if (pFVar6->fUseImps != 0) {
      Fra_ImpCompactArray(p->pCla->vImps);
      return;
    }
  }
  return;
}

Assistant:

void Fra_FraigSweep( Fra_Man_t * p )
{
//    Bar_Progress_t * pProgress = NULL;
    Aig_Obj_t * pObj, * pObjNew;
    int i, Pos = 0;
    int nBTracksOld;
    // fraig latch outputs
    Aig_ManForEachLoSeq( p->pManAig, pObj, i )
    {
        Fra_FraigNode( p, pObj );
        if ( p->pPars->fUseImps )
            Pos = Fra_ImpCheckForNode( p, p->pCla->vImps, pObj, Pos );
    }
    if ( p->pPars->fLatchCorr )
        return;
    // fraig internal nodes
//    if ( !p->pPars->fDontShowBar )
//        pProgress = Bar_ProgressStart( stdout, Aig_ManObjNumMax(p->pManAig) );
    nBTracksOld = p->pPars->nBTLimitNode;
    Aig_ManForEachNode( p->pManAig, pObj, i )
    {
//        if ( pProgress )
//            Bar_ProgressUpdate( pProgress, i, NULL );
        // derive and remember the new fraig node
        pObjNew = Aig_And( p->pManFraig, Fra_ObjChild0Fra(pObj,p->pPars->nFramesK), Fra_ObjChild1Fra(pObj,p->pPars->nFramesK) );
        Fra_ObjSetFraig( pObj, p->pPars->nFramesK, pObjNew );
        Aig_Regular(pObjNew)->pData = p;
        // quit if simulation detected a counter-example for a PO
        if ( p->pManFraig->pData )
            continue;
//        if ( Aig_SupportSize(p->pManAig,pObj) > 16 )
//            continue;
        // perform fraiging
        if ( p->pPars->nLevelMax && (int)pObj->Level > p->pPars->nLevelMax )
            p->pPars->nBTLimitNode = 5;
        Fra_FraigNode( p, pObj );
        if ( p->pPars->nLevelMax && (int)pObj->Level > p->pPars->nLevelMax )
            p->pPars->nBTLimitNode = nBTracksOld;
        // check implications
        if ( p->pPars->fUseImps )
            Pos = Fra_ImpCheckForNode( p, p->pCla->vImps, pObj, Pos );
    }
//    if ( pProgress )
//        Bar_ProgressStop( pProgress );
    // try to prove the outputs of the miter
    p->nNodesMiter = Aig_ManNodeNum(p->pManFraig);
//    Fra_MiterStatus( p->pManFraig );
//    if ( p->pPars->fProve && p->pManFraig->pData == NULL )
//        Fra_MiterProve( p );
    // compress implications after processing all of them
    if ( p->pPars->fUseImps )
        Fra_ImpCompactArray( p->pCla->vImps );
}